

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O1

vec4 ImageCodec::decodeFLOAT_UINTPacked<unsigned_int>(ImageCodec *codec,void *ptr)

{
  pointer pSVar1;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 aVar2;
  uint32_t *puVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_18 = 0;
  uStack_10 = 0x3f80000000000000;
  pSVar1 = (codec->packedSampleInfo).
           super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(codec->packedSampleInfo).
                super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pSVar1;
  if (lVar4 != 0) {
    lVar4 = (lVar4 >> 2) * -0x5555555555555555;
    puVar3 = &pSVar1->bitLength;
    lVar5 = 0;
    do {
      if (lVar5 == 4) {
        __assert_fail("i >= 0 && i < this->length()",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/other_include/glm/gtc/../gtc/../detail/../detail/type_vec4.inl"
                      ,0x14a,
                      "T &glm::vec<4, float>::operator[](typename vec<4, T, P>::length_type) [L = 4, T = float, P = glm::packed_highp]"
                     );
      }
      uVar6 = ~(-1 << ((byte)*puVar3 & 0x1f));
      *(float *)((long)&local_18 + (ulong)((uint)lVar5 & 3) * 4) =
           (float)(int)(*(uint *)((long)ptr + (ulong)((SampleInfo *)(puVar3 + -2))->elementIndex * 4
                                 ) >> ((byte)puVar3[-1] & 0x1f) & uVar6) / (float)(int)uVar6;
      lVar5 = lVar5 + 1;
      puVar3 = puVar3 + 3;
    } while (lVar4 + (ulong)(lVar4 == 0) != lVar5);
  }
  aVar2._8_8_ = uStack_10;
  aVar2._0_8_ = local_18;
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)aVar2.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_UINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            const auto upper = static_cast<float>((1u << info.bitLength) - 1u);
            uint32_t rawValue = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
            result[static_cast<glm::length_t>(i)] = static_cast<float>(rawValue) / upper;
        }
        return result;
    }